

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Impl *pIVar4;
  String *pSVar5;
  EntryImpl *this_01;
  Own<const_kj::Directory> *pOVar6;
  Directory *pDVar7;
  PathPtr PVar8;
  StringPtr name;
  StringPtr value;
  Fault local_120;
  Fault f_1;
  StringPtr local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  OwnOwn<const_kj::Directory> child;
  SymlinkNode local_a8;
  ArrayPtr<const_char> local_88;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_78;
  EntryImpl *local_70;
  EntryImpl *entry;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_48;
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  StringPtr content_local;
  PathPtr path_local;
  
  content_local.content.ptr = (char *)content.content.size_;
  content_local.content.size_ = (size_t)path.parts.ptr;
  f.exception._4_4_ = mode;
  sVar3 = PathPtr::size((PathPtr *)&content_local.content.size_);
  if (sVar3 == 0) {
    bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE);
    if (bVar1) {
      path_local.parts.size_._7_1_ = false;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4d4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      path_local.parts.size_._7_1_ = false;
      kj::_::Debug::Fault::~Fault(&local_48);
    }
  }
  else {
    sVar3 = PathPtr::size((PathPtr *)&content_local.content.size_);
    if (sVar3 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pSVar5 = PathPtr::operator[]((PathPtr *)&content_local.content.size_,0);
      StringPtr::StringPtr((StringPtr *)&local_88,pSVar5);
      local_78 = Impl::openEntry(pIVar4,(StringPtr)local_88,f.exception._4_4_);
      this_01 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>(&local_78)
      ;
      path_local.parts.size_._7_1_ = this_01 != (EntryImpl *)0x0;
      local_70 = this_01;
      if (path_local.parts.size_._7_1_) {
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
        local_a8.lastModified.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)pIVar4->clock)();
        value.content.size_ = (size_t)local_a8.lastModified.value.value;
        value.content.ptr = content_local.content.ptr;
        heapString(&local_a8.content,(kj *)content.content.ptr,value);
        EntryImpl::init(this_01,(EVP_PKEY_CTX *)&local_a8);
        SymlinkNode::~SymlinkNode(&local_a8);
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
        Impl::modified(pIVar4);
      }
      child.value.ptr._4_4_ = 1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
    }
    else {
      pSVar5 = PathPtr::operator[]((PathPtr *)&content_local.content.size_,0);
      StringPtr::StringPtr(&local_f0,pSVar5);
      name.content.size_ = (size_t)local_f0.content.ptr;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_e0,name,(WriteMode)local_f0.content.size_);
      kj::_::readMaybe<kj::Directory_const>
                ((_ *)local_d0,(Maybe<kj::Own<const_kj::Directory>_> *)local_e0);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_e0)
      ;
      pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_d0);
      if (pOVar6 == (Own<const_kj::Directory> *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                  (&local_120,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x4e3,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                   (char (*) [33])"couldn\'t create parent directory");
        path_local.parts.size_._7_1_ = false;
        child.value.ptr._4_4_ = 1;
        kj::_::Debug::Fault::~Fault(&local_120);
      }
      else {
        pOVar6 = kj::_::OwnOwn<const_kj::Directory>::operator->
                           ((OwnOwn<const_kj::Directory> *)local_d0);
        pDVar7 = Own<const_kj::Directory>::get(pOVar6);
        this_00 = &content_local.content.size_;
        sVar3 = PathPtr::size((PathPtr *)this_00);
        PVar8 = PathPtr::slice((PathPtr *)this_00,1,sVar3);
        this_local._0_4_ = content.content.ptr._0_4_;
        this_local._4_4_ = content.content.ptr._4_4_;
        f_1.exception._0_4_ = this_local._0_4_;
        f_1.exception._4_4_ = this_local._4_4_;
        iVar2 = (*(pDVar7->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                          (pDVar7,PVar8.parts.ptr,PVar8.parts.size_,(kj *)content.content.ptr,
                           content_local.content.ptr,(ulong)f.exception._4_4_);
        path_local.parts.size_._7_1_ = (bool)((byte)iVar2 & 1);
        child.value.ptr._4_4_ = 1;
      }
      kj::_::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_d0);
    }
  }
  return path_local.parts.size_._7_1_;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        entry->init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }